

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void __thiscall
CPP::WriteInitialization::acceptTabStops(WriteInitialization *this,DomTabStops *tabStops)

{
  ulong uVar1;
  FILE *__stream;
  QTextStream *pQVar2;
  char *pcVar3;
  QString *attributeName;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_70.d = (tabStops->m_tabStop).d.d;
  local_70.ptr = (tabStops->m_tabStop).d.ptr;
  uVar1 = (tabStops->m_tabStop).d.size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar5 = 0;
  uVar4 = 0;
  local_70.size = uVar1;
  do {
    if (uVar1 <= uVar4) {
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    attributeName = (QString *)((long)&((local_70.ptr)->d).d + lVar5);
    Driver::widgetVariableName((QString *)&local_88,this->m_driver,attributeName);
    __stream = _stderr;
    if (local_88.size == 0) {
      Option::messagePrefix((QString *)&local_b8,this->m_option);
      QString::toLocal8Bit((QByteArray *)&local_a0,(QString *)&local_b8);
      pcVar6 = local_a0.ptr;
      if (local_a0.ptr == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      QString::toLocal8Bit((QByteArray *)&local_d0,attributeName);
      pcVar3 = local_d0.ptr;
      if (local_d0.ptr == (char *)0x0) {
        pcVar3 = (char *)&QByteArray::_empty;
      }
      fprintf(__stream,"%s: Warning: Tab-stop assignment: \'%s\' is not a valid widget.\n",pcVar6,
              pcVar3);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_d0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    }
    else {
      if (lVar5 != 0) {
        if (local_58.size == 0) goto LAB_0012bdbb;
        pQVar2 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_indent);
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"QWidget");
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)language::qualifier);
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"setTabOrder(");
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_58);
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,", ");
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_88);
        pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,')');
        QTextStream::operator<<(pQVar2,(QString *)language::eol);
      }
      QString::operator=((QString *)&local_58,(QString *)&local_88);
    }
LAB_0012bdbb:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

void WriteInitialization::acceptTabStops(DomTabStops *tabStops)
{
    QString lastName;

    const QStringList l = tabStops->elementTabStop();
    for (int i=0; i<l.size(); ++i) {
        const QString name = m_driver->widgetVariableName(l.at(i));

        if (name.isEmpty()) {
            fprintf(stderr, "%s: Warning: Tab-stop assignment: '%s' is not a valid widget.\n",
                    qPrintable(m_option.messagePrefix()), qPrintable(l.at(i)));
            continue;
        }

        if (i == 0) {
            lastName = name;
            continue;
        }
        if (name.isEmpty() || lastName.isEmpty())
            continue;

        m_output << m_indent << "QWidget" << language::qualifier << "setTabOrder("
            << lastName << ", " << name << ')' << language::eol;

        lastName = name;
    }
}